

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileAccess.cpp
# Opt level: O2

void EscapeRegex(string *regex)

{
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"\\",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\\\\",&local_4a);
  ReplaceAll(regex,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"^",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\\^",&local_4a);
  ReplaceAll(regex,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,".",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\\.",&local_4a);
  ReplaceAll(regex,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"$",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\\$",&local_4a);
  ReplaceAll(regex,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"|",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\\|",&local_4a);
  ReplaceAll(regex,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"(",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\\(",&local_4a);
  ReplaceAll(regex,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,")",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\\)",&local_4a);
  ReplaceAll(regex,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"[",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\\[",&local_4a);
  ReplaceAll(regex,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"]",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\\]",&local_4a);
  ReplaceAll(regex,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"*",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\\*",&local_4a);
  ReplaceAll(regex,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"+",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\\+",&local_4a);
  ReplaceAll(regex,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"?",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\\?",&local_4a);
  ReplaceAll(regex,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"/",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\\/",&local_4a);
  ReplaceAll(regex,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void EscapeRegex(std::string& regex)
{
   ReplaceAll(regex, "\\", "\\\\");
   ReplaceAll(regex, "^", "\\^");
   ReplaceAll(regex, ".", "\\.");
   ReplaceAll(regex, "$", "\\$");
   ReplaceAll(regex, "|", "\\|");
   ReplaceAll(regex, "(", "\\(");
   ReplaceAll(regex, ")", "\\)");
   ReplaceAll(regex, "[", "\\[");
   ReplaceAll(regex, "]", "\\]");
   ReplaceAll(regex, "*", "\\*");
   ReplaceAll(regex, "+", "\\+");
   ReplaceAll(regex, "?", "\\?");
   ReplaceAll(regex, "/", "\\/");
}